

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGParseStart(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict local_38;
  xmlRelaxNGDefinePtr_conflict last;
  xmlRelaxNGDefinePtr_conflict def;
  int ret;
  xmlNodePtr nodes_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if (nodes == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x452,"start has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
    ctxt_local._4_4_ = -1;
  }
  else {
    if ((((nodes == (xmlNodePtr)0x0) || (nodes->ns == (xmlNs *)0x0)) ||
        (nodes->type != XML_ELEMENT_NODE)) ||
       ((iVar1 = xmlStrEqual(nodes->name,"empty"), iVar1 == 0 ||
        (iVar1 = xmlStrEqual(nodes->ns->href,xmlRelaxNGNs), iVar1 == 0)))) {
      if ((((nodes == (xmlNodePtr)0x0) ||
           ((nodes->ns == (xmlNs *)0x0 || (nodes->type != XML_ELEMENT_NODE)))) ||
          (iVar1 = xmlStrEqual(nodes->name,(xmlChar *)"notAllowed"), iVar1 == 0)) ||
         (iVar1 = xmlStrEqual(nodes->ns->href,xmlRelaxNGNs), iVar1 == 0)) {
        last = xmlRelaxNGParsePatterns(ctxt,nodes,1);
      }
      else {
        last = xmlRelaxNGNewDefine(ctxt,nodes);
        if (last == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return -1;
        }
        last->type = XML_RELAXNG_NOT_ALLOWED;
        if (nodes->children != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,nodes,0x41f,"element notAllowed is not empty\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
        }
      }
    }
    else {
      last = xmlRelaxNGNewDefine(ctxt,nodes);
      if (last == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return -1;
      }
      last->type = XML_RELAXNG_EMPTY;
      if (nodes->children != (_xmlNode *)0x0) {
        xmlRngPErr(ctxt,nodes,0x400,"element empty is not empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
    if (ctxt->grammar->start == (xmlRelaxNGDefinePtr_conflict)0x0) {
      ctxt->grammar->start = last;
    }
    else {
      for (local_38 = ctxt->grammar->start; local_38->next != (xmlRelaxNGDefinePtr)0x0;
          local_38 = local_38->next) {
      }
      local_38->next = last;
    }
    if (nodes->next == (xmlNodePtr)0x0) {
      ctxt_local._4_4_ = 0;
    }
    else {
      xmlRngPErr(ctxt,nodes->next,0x451,"start more than one children\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
      ctxt_local._4_4_ = -1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGParseStart(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes)
{
    int ret = 0;
    xmlRelaxNGDefinePtr def = NULL, last;

    if (nodes == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_START_EMPTY, "start has no children\n",
                   NULL, NULL);
        return (-1);
    }
    if (IS_RELAXNG(nodes, "empty")) {
        def = xmlRelaxNGNewDefine(ctxt, nodes);
        if (def == NULL)
            return (-1);
        def->type = XML_RELAXNG_EMPTY;
        if (nodes->children != NULL) {
            xmlRngPErr(ctxt, nodes, XML_RNGP_EMPTY_CONTENT,
                       "element empty is not empty\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(nodes, "notAllowed")) {
        def = xmlRelaxNGNewDefine(ctxt, nodes);
        if (def == NULL)
            return (-1);
        def->type = XML_RELAXNG_NOT_ALLOWED;
        if (nodes->children != NULL) {
            xmlRngPErr(ctxt, nodes, XML_RNGP_NOTALLOWED_NOT_EMPTY,
                       "element notAllowed is not empty\n", NULL, NULL);
        }
    } else {
        def = xmlRelaxNGParsePatterns(ctxt, nodes, 1);
    }
    if (ctxt->grammar->start != NULL) {
        last = ctxt->grammar->start;
        while (last->next != NULL)
            last = last->next;
        last->next = def;
    } else {
        ctxt->grammar->start = def;
    }
    nodes = nodes->next;
    if (nodes != NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_START_CONTENT,
                   "start more than one children\n", NULL, NULL);
        return (-1);
    }
    return (ret);
}